

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>::iterator,_bool>
* __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,std::default_delete<int>>>,phmap::priv::(anonymous_namespace)::ParallelFlatHashSet_MergeExtractInsert_Test::TestBody()::Hash,phmap::priv::(anonymous_namespace)::ParallelFlatHashSet_MergeExtractInsert_Test::TestBody()::Eq,std::allocator<std::unique_ptr<int,std::default_delete<int>>>>
::InsertSlot<false>::operator()
          (pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>::iterator,_bool>
           *__return_storage_ptr__,void *this,unique_ptr<int,_std::default_delete<int>_> *key,
          unique_ptr<int,_std::default_delete<int>_> *param_2)

{
  raw_hash_set<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
  *this_00;
  unsigned_long i;
  ctrl_t h;
  allocator_type *alloc;
  pair<unsigned_long,_bool> pVar1;
  iterator local_58;
  unsigned_long local_48;
  undefined1 local_40;
  unsigned_long local_38;
  pair<unsigned_long,_bool> res;
  size_t hashval;
  unique_ptr<int,_std::default_delete<int>_> *param_2_local;
  unique_ptr<int,_std::default_delete<int>_> *key_local;
  InsertSlot<false> *this_local;
  
  res._8_8_ = hash<std::unique_ptr<int,std::default_delete<int>>>(*this,key);
  pVar1 = find_or_prepare_insert<std::unique_ptr<int,std::default_delete<int>>>(*this,key,res._8_8_)
  ;
  local_48 = pVar1.first;
  local_40 = pVar1.second;
  local_38 = local_48;
  res.first._0_1_ = local_40;
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    alloc = raw_hash_set<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
            ::alloc_ref(*this);
    hash_policy_traits<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,std::default_delete<int>>>,void>
    ::transfer<std::allocator<std::unique_ptr<int,std::default_delete<int>>>>
              (alloc,(slot_type *)(*(long *)(*this + 8) + local_38 * 8),
               *(slot_type **)((long)this + 8));
    i = local_38;
    this_00 = *this;
    h = H2(res._8_8_);
    raw_hash_set<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
    ::set_ctrl(this_00,i,h);
  }
  local_58 = raw_hash_set<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
             ::iterator_at(*this,local_38);
  std::
  pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>::iterator,_bool>
  ::
  pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>::iterator,_bool_&,_true>
            (__return_storage_ptr__,&local_58,(bool *)&res);
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> operator()(const K& key, Args&&...) && {
            size_t hashval = s.hash(key);
            auto res = s.find_or_prepare_insert(key, hashval);
            if (res.second) {
                PolicyTraits::transfer(&s.alloc_ref(), s.slots_ + res.first, &slot);
                s.set_ctrl(res.first, H2(hashval));
            } else if (do_destroy) {
                PolicyTraits::destroy(&s.alloc_ref(), &slot);
            }
            return {s.iterator_at(res.first), res.second};
        }